

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  byte bVar2;
  sqlite3_value *pVal;
  void *pvVar3;
  int n;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  uchar *puVar9;
  uchar **p;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  char *local_68;
  
  pVal = *argv;
  uVar8._0_2_ = pVal->flags;
  uVar8._2_1_ = pVal->enc;
  uVar8._3_1_ = pVal->eSubtype;
  if ((0xaaaaaaaaU >> (uVar8 & 0x1f) & 1) == 0) {
    uVar11 = 1;
    local_68 = (char *)sqlite3ValueText(pVal,'\x01');
    if (local_68 != (char *)0x0) {
      n = sqlite3ValueBytes(*argv,'\x01');
      if (argc == 1) {
        p = trimFunc::azOne;
        puVar9 = "\x01";
LAB_0019599e:
        if (0 < (int)uVar11) {
          pvVar3 = context->pFunc->pUserData;
          if ((0 < n & (byte)pvVar3) == 1) {
            do {
              bVar12 = true;
              uVar7 = 1;
              do {
                bVar2 = *(byte *)((long)puVar9 + (uVar7 - 1));
                uVar8 = (uint)bVar2;
                if (((int)(uint)bVar2 <= n) &&
                   (iVar4 = bcmp(local_68,p[uVar7 - 1],(ulong)bVar2), iVar4 == 0))
                goto LAB_00195a30;
                bVar12 = uVar7 < (uVar11 & 0xffffffff);
                bVar13 = uVar7 != (uVar11 & 0xffffffff);
                uVar7 = uVar7 + 1;
              } while (bVar13);
              uVar8 = 0;
LAB_00195a30:
              n = n - uVar8;
              local_68 = local_68 + uVar8;
            } while ((bVar12) && (0 < n));
          }
          if ((((ulong)pvVar3 & 2) != 0) && (0 < n)) {
            uVar7 = 1;
            if (1 < (int)uVar11) {
              uVar7 = uVar11 & 0xffffffff;
            }
            do {
              bVar12 = true;
              uVar10 = 1;
              do {
                bVar2 = *(byte *)((long)puVar9 + (uVar10 - 1));
                uVar8 = (uint)bVar2;
                if (((int)(uint)bVar2 <= n) &&
                   (iVar4 = bcmp(local_68 + ((long)n - (ulong)bVar2),p[uVar10 - 1],(ulong)bVar2),
                   iVar4 == 0)) goto LAB_00195acf;
                bVar12 = uVar10 < (uVar11 & 0xffffffff);
                bVar13 = uVar10 != uVar7;
                uVar10 = uVar10 + 1;
              } while (bVar13);
              uVar8 = 0;
LAB_00195acf:
              n = n - uVar8;
            } while ((bVar12) && (0 < n));
          }
          if (argc != 1) {
            sqlite3_free(p);
          }
        }
        setResultStrOrError(context,local_68,n,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
      puVar5 = (uchar *)sqlite3ValueText(argv[1],'\x01');
      if (puVar5 != (uchar *)0x0) {
        uVar11 = 0;
        uVar1 = *puVar5;
        puVar9 = puVar5;
        while (uVar1 != '\0') {
          puVar9 = puVar9 + 1;
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar1 = *puVar9;
        }
        bVar12 = true;
        if ((int)uVar11 == 0) {
          puVar9 = (uchar *)0x0;
          p = (uchar **)0x0;
        }
        else {
          p = (uchar **)contextMalloc(context,uVar11 * 9);
          puVar9 = (uchar *)0x0;
          if (p == (uchar **)0x0) {
            p = (uchar **)0x0;
            bVar12 = false;
          }
          else {
            puVar9 = (uchar *)(p + uVar11);
            if (*puVar5 == '\0') {
              uVar11 = 0;
            }
            else {
              uVar11 = 0;
              do {
                p[uVar11] = puVar5;
                puVar6 = puVar5 + 1;
                *(char *)((long)puVar9 + uVar11) = (char)puVar6 - (char)puVar5;
                uVar11 = uVar11 + 1;
                puVar5 = puVar6;
              } while (*puVar6 != '\0');
            }
            bVar12 = true;
          }
        }
        if (bVar12) goto LAB_0019599e;
      }
    }
  }
  return;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  int nIn;                          /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned char *aLen = 0;          /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned char lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (u8*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context, ((i64)nChar)*(sizeof(char*)+1));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned char*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (u8)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}